

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

bool __thiscall sf::Texture::generateMipmap(Texture *this)

{
  bool bVar1;
  TransientContextLock lock;
  TextureSaver save;
  TransientContextLock local_15;
  TextureSaver local_14;
  
  if (this->m_texture == 0) {
    bVar1 = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&local_15);
    priv::ensureExtensionsInit();
    bVar1 = SF_GLAD_GL_EXT_framebuffer_object != 0;
    if (bVar1) {
      priv::TextureSaver::TextureSaver(&local_14);
      (*sf_glad_glBindTexture)(0xde1,this->m_texture);
      (*sf_glad_glGenerateMipmapEXT)(0xde1);
      (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2702);
      this->m_hasMipmap = true;
      priv::TextureSaver::~TextureSaver(&local_14);
    }
    GlResource::TransientContextLock::~TransientContextLock(&local_15);
  }
  return bVar1;
}

Assistant:

bool Texture::generateMipmap()
{
    if (!m_texture)
        return false;

    TransientContextLock lock;

    // Make sure that extensions are initialized
    priv::ensureExtensionsInit();

    if (!GLEXT_framebuffer_object)
        return false;

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(GLEXT_glGenerateMipmap(GL_TEXTURE_2D));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR_MIPMAP_LINEAR : GL_NEAREST_MIPMAP_LINEAR));

    m_hasMipmap = true;

    return true;
}